

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

Curl_dns_entry * fetch_addr(Curl_easy *data,char *hostname,int port)

{
  bool bVar1;
  int iVar2;
  Curl_addrinfo *local_168;
  Curl_addrinfo *addr;
  _Bool found;
  time_t tStack_158;
  int pf;
  hostcache_prune_data user;
  size_t entry_len;
  char entry_id [262];
  Curl_dns_entry *local_28;
  Curl_dns_entry *dns;
  int port_local;
  char *hostname_local;
  Curl_easy *data_local;
  
  user._16_8_ = create_hostcache_id(hostname,0,port,(char *)&entry_len,0x106);
  local_28 = (Curl_dns_entry *)Curl_hash_pick((data->dns).hostcache,&entry_len,user._16_8_ + 1);
  if ((local_28 == (Curl_dns_entry *)0x0) &&
     ((*(uint *)&(data->state).field_0x774 >> 0x10 & 1) != 0)) {
    user._16_8_ = create_hostcache_id("*",1,port,(char *)&entry_len,0x106);
    local_28 = (Curl_dns_entry *)Curl_hash_pick((data->dns).hostcache,&entry_len,user._16_8_ + 1);
  }
  if ((local_28 != (Curl_dns_entry *)0x0) && ((data->set).dns_cache_timeout != -1)) {
    tStack_158 = time((time_t *)0x0);
    user.oldest._0_4_ = (data->set).dns_cache_timeout;
    user.now = 0;
    iVar2 = hostcache_entry_is_stale(&stack0xfffffffffffffea8,local_28);
    if (iVar2 != 0) {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,"Hostname in DNS cache was stale, zapped");
      }
      local_28 = (Curl_dns_entry *)0x0;
      Curl_hash_delete((data->dns).hostcache,&entry_len,user._16_8_ + 1);
    }
  }
  if ((local_28 != (Curl_dns_entry *)0x0) && (data->conn->ip_version != '\0')) {
    addr._4_4_ = 2;
    bVar1 = false;
    local_168 = local_28->addr;
    if (data->conn->ip_version == '\x02') {
      addr._4_4_ = 10;
    }
    for (; local_168 != (Curl_addrinfo *)0x0; local_168 = local_168->ai_next) {
      if (local_168->ai_family == addr._4_4_) {
        bVar1 = true;
        break;
      }
    }
    if (!bVar1) {
      if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
         (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) {
        Curl_infof(data,"Hostname in DNS cache does not have needed family, zapped");
      }
      local_28 = (Curl_dns_entry *)0x0;
      Curl_hash_delete((data->dns).hostcache,&entry_len,user._16_8_ + 1);
    }
  }
  return local_28;
}

Assistant:

static struct Curl_dns_entry *fetch_addr(struct Curl_easy *data,
                                         const char *hostname,
                                         int port)
{
  struct Curl_dns_entry *dns = NULL;
  char entry_id[MAX_HOSTCACHE_LEN];

  /* Create an entry id, based upon the hostname and port */
  size_t entry_len = create_hostcache_id(hostname, 0, port,
                                         entry_id, sizeof(entry_id));

  /* See if it is already in our dns cache */
  dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);

  /* No entry found in cache, check if we might have a wildcard entry */
  if(!dns && data->state.wildcard_resolve) {
    entry_len = create_hostcache_id("*", 1, port, entry_id, sizeof(entry_id));

    /* See if it is already in our dns cache */
    dns = Curl_hash_pick(data->dns.hostcache, entry_id, entry_len + 1);
  }

  if(dns && (data->set.dns_cache_timeout != -1)) {
    /* See whether the returned entry is stale. Done before we release lock */
    struct hostcache_prune_data user;

    user.now = time(NULL);
    user.max_age_sec = data->set.dns_cache_timeout;
    user.oldest = 0;

    if(hostcache_entry_is_stale(&user, dns)) {
      infof(data, "Hostname in DNS cache was stale, zapped");
      dns = NULL; /* the memory deallocation is being handled by the hash */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
    }
  }

  /* See if the returned entry matches the required resolve mode */
  if(dns && data->conn->ip_version != CURL_IPRESOLVE_WHATEVER) {
    int pf = PF_INET;
    bool found = FALSE;
    struct Curl_addrinfo *addr = dns->addr;

#ifdef PF_INET6
    if(data->conn->ip_version == CURL_IPRESOLVE_V6)
      pf = PF_INET6;
#endif

    while(addr) {
      if(addr->ai_family == pf) {
        found = TRUE;
        break;
      }
      addr = addr->ai_next;
    }

    if(!found) {
      infof(data, "Hostname in DNS cache does not have needed family, zapped");
      dns = NULL; /* the memory deallocation is being handled by the hash */
      Curl_hash_delete(data->dns.hostcache, entry_id, entry_len + 1);
    }
  }
  return dns;
}